

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall spv::Builder::createCompositeExtract(Builder *this,Id composite,Id typeId,uint index)

{
  Id resultId;
  Instruction *this_00;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_78;
  Instruction *local_70;
  Instruction *extract;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_60;
  allocator<unsigned_int> local_41;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_40;
  uint local_24;
  Id local_20;
  uint index_local;
  Id typeId_local;
  Id composite_local;
  Builder *this_local;
  
  local_24 = index;
  local_20 = typeId;
  index_local = composite;
  _typeId_local = this;
  if ((this->generatingOpCodeForSpecConst & 1U) == 0) {
    this_00 = (Instruction *)::operator_new(0x60);
    resultId = getUniqueId(this);
    spv::Instruction::Instruction(this_00,resultId,local_20,OpCompositeExtract);
    local_70 = this_00;
    spv::Instruction::reserveOperands(this_00,2);
    spv::Instruction::addIdOperand(local_70,index_local);
    spv::Instruction::addImmediateOperand(local_70,local_24);
    std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
    unique_ptr<std::default_delete<spv::Instruction>,void>
              ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)&local_78,
               local_70);
    addInstruction(this,&local_78);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_78);
    this_local._4_4_ = spv::Instruction::getResultId(local_70);
  }
  else {
    std::allocator<unsigned_int>::allocator(&local_41);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_40,1,&index_local,&local_41);
    std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)((long)&extract + 7));
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_60,1,&local_24,(allocator_type *)((long)&extract + 7));
    this_local._4_4_ = createSpecConstantOp(this,OpCompositeExtract,typeId,&local_40,&local_60);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_60);
    std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&extract + 7));
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_40);
    std::allocator<unsigned_int>::~allocator(&local_41);
  }
  return this_local._4_4_;
}

Assistant:

Id Builder::createCompositeExtract(Id composite, Id typeId, unsigned index)
{
    // Generate code for spec constants if in spec constant operation
    // generation mode.
    if (generatingOpCodeForSpecConst) {
        return createSpecConstantOp(OpCompositeExtract, typeId, std::vector<Id>(1, composite),
            std::vector<Id>(1, index));
    }
    Instruction* extract = new Instruction(getUniqueId(), typeId, OpCompositeExtract);
    extract->reserveOperands(2);
    extract->addIdOperand(composite);
    extract->addImmediateOperand(index);
    addInstruction(std::unique_ptr<Instruction>(extract));

    return extract->getResultId();
}